

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2e03bb::PointerType::printRight(PointerType *this,OutputStream *s)

{
  Cache CVar1;
  ObjCProtoName *this_00;
  Node *pNVar2;
  bool bVar3;
  int iVar4;
  char cVar5;
  
  this_00 = (ObjCProtoName *)this->Pointee;
  if ((this_00->super_Node).K == KObjCProtoName) {
    bVar3 = ObjCProtoName::isObjCObject(this_00);
    if (bVar3) {
      return;
    }
  }
  CVar1 = (this_00->super_Node).ArrayCache;
  if (CVar1 == Unknown) {
    iVar4 = (*(this_00->super_Node)._vptr_Node[1])(this_00,s);
    cVar5 = (char)iVar4;
  }
  else {
    cVar5 = CVar1 == Yes;
  }
  if (cVar5 == '\0') {
    pNVar2 = this->Pointee;
    if (pNVar2->FunctionCache == Unknown) {
      iVar4 = (*pNVar2->_vptr_Node[2])(pNVar2,s);
      cVar5 = (char)iVar4;
    }
    else {
      cVar5 = pNVar2->FunctionCache == Yes;
    }
    if (cVar5 == '\0') goto LAB_001975da;
  }
  OutputStream::grow(s,1);
  s->Buffer[s->CurrentPosition] = ')';
  s->CurrentPosition = s->CurrentPosition + 1;
LAB_001975da:
  (*this->Pointee->_vptr_Node[5])(this->Pointee,s);
  return;
}

Assistant:

void printRight(OutputStream &s) const override {
    if (Pointee->getKind() != KObjCProtoName ||
        !static_cast<const ObjCProtoName *>(Pointee)->isObjCObject()) {
      if (Pointee->hasArray(s) || Pointee->hasFunction(s))
        s += ")";
      Pointee->printRight(s);
    }
  }